

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indented_writer.h
# Opt level: O3

void __thiscall ctemplate::IndentedWriter::IndentLine(IndentedWriter *this)

{
  string *psVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->line_state_ == AT_BEGINNING) {
    psVar1 = this->out_;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct((ulong)local_40,(char)this->current_indentation_);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      plVar4 = &local_50;
    }
    else {
      local_50 = *plVar3;
      plVar4 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)plVar4);
    if (plVar4 != &local_50) {
      operator_delete(plVar4);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    return;
  }
  __assert_fail("line_state_ == AT_BEGINNING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/indented_writer.h"
                ,0x74,"void ctemplate::IndentedWriter::IndentLine()");
}

Assistant:

void IndentLine() {
    assert(line_state_ == AT_BEGINNING);
    out_->append(string(current_indentation_, ' ') +
                 (current_indentation_ ? " " : ""));
  }